

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_storage.hpp
# Opt level: O2

FunctionData * __thiscall
inja::FunctionStorage::find_function
          (FunctionData *__return_storage_ptr__,FunctionStorage *this,string_view name,int num_args)

{
  const_iterator cVar1;
  const_iterator cVar2;
  bool bVar3;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_88,&local_40,&local_89);
  local_68._8_8_ = local_88._M_string_length;
  local_68._M_unused._M_object = &local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    local_58._8_8_ = local_88.field_2._8_8_;
  }
  else {
    local_68._M_unused._M_object = local_88._M_dataplus._M_p;
  }
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_48 = num_args;
  cVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>_>
          ::find(&(this->function_storage)._M_t,(key_type *)&local_68);
  ::std::__cxx11::string::~string((string *)local_68._M_pod_data);
  ::std::__cxx11::string::~string((string *)&local_88);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->function_storage)._M_t._M_impl.super__Rb_tree_header) {
    if (0 < num_args) {
      ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_88,&local_40,&local_89);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)&local_68,&local_88,&this->VARIADIC);
      cVar2 = std::
              _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>_>
              ::find(&(this->function_storage)._M_t,(key_type *)&local_68);
      ::std::__cxx11::string::~string((string *)local_68._M_pod_data);
      ::std::__cxx11::string::~string((string *)&local_88);
      bVar3 = cVar2._M_node != cVar1._M_node;
      cVar1 = cVar2;
      if (bVar3) goto LAB_001176e7;
    }
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    __return_storage_ptr__->operation = None;
    std::
    function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
    ::function(&__return_storage_ptr__->callback,
               (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  else {
LAB_001176e7:
    FunctionData::FunctionData(__return_storage_ptr__,(FunctionData *)&cVar1._M_node[2]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

FunctionData find_function(std::string_view name, int num_args) const {
    auto it = function_storage.find(std::make_pair(static_cast<std::string>(name), num_args));
    if (it != function_storage.end()) {
      return it->second;

      // Find variadic function
    } else if (num_args > 0) {
      it = function_storage.find(std::make_pair(static_cast<std::string>(name), VARIADIC));
      if (it != function_storage.end()) {
        return it->second;
      }
    }

    return FunctionData {Operation::None};
  }